

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O0

void refresh_stock(game_event_type type,game_event_data *unused,void *user)

{
  menu_conflict *menu;
  store_context *ctx;
  void *user_local;
  game_event_data *unused_local;
  game_event_type type_local;
  
  store_stock_list(*(store **)((long)user + 0xb0),*(object ***)((long)user + 0xb8),
                   (uint)z_info->store_inven_max);
  store_display_recalc((store_context *)user);
  store_menu_recalc((menu_conflict *)user);
  store_redraw((store_context *)user);
  return;
}

Assistant:

static void refresh_stock(game_event_type type, game_event_data *unused, void *user)
{
	struct store_context *ctx = user;
	struct menu *menu = &ctx->menu;

	store_stock_list(ctx->store, ctx->list, z_info->store_inven_max);

	/* Display the store */
	store_display_recalc(ctx);
	store_menu_recalc(menu);
	store_redraw(ctx);
}